

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void DecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s,int position)

{
  size_t *psVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  long *plVar5;
  uint *puVar6;
  HuffmanCode **ppHVar7;
  byte bVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint32_t uVar13;
  HuffmanCode *pHVar14;
  ulong uVar15;
  HuffmanCode *pHVar16;
  
  uVar4 = s->num_block_types[0];
  if (1 < uVar4) {
    pHVar14 = s->block_type_trees;
    uVar10 = (s->br).bit_pos_;
    uVar12 = (s->br).val_;
    if (0x2f < uVar10) {
      (s->br).val_ = uVar12 >> 0x30;
      uVar10 = uVar10 ^ 0x30;
      (s->br).bit_pos_ = uVar10;
      plVar5 = (long *)(s->br).next_in;
      uVar12 = uVar12 >> 0x30 | *plVar5 << 0x10;
      (s->br).val_ = uVar12;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 6;
      (s->br).next_in = (uint8_t *)((long)plVar5 + 6);
    }
    uVar15 = uVar12 >> ((byte)uVar10 & 0x3f);
    pHVar14 = pHVar14 + (uVar15 & 0xff);
    bVar8 = pHVar14->bits;
    if (8 < bVar8) {
      uVar10 = uVar10 + 8;
      pHVar14 = pHVar14 + (((uint)(uVar15 >> 8) & 0xffffff & kBitMask[bVar8 - 8]) +
                          (uint)pHVar14->value);
      bVar8 = pHVar14->bits;
    }
    pHVar16 = s->block_len_trees;
    uVar10 = bVar8 + uVar10;
    uVar2 = pHVar14->value;
    if (0x2f < uVar10) {
      (s->br).val_ = uVar12 >> 0x30;
      plVar5 = (long *)(s->br).next_in;
      uVar12 = uVar12 >> 0x30 | *plVar5 << 0x10;
      (s->br).val_ = uVar12;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 6;
      uVar10 = uVar10 ^ 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar5 + 6);
    }
    uVar15 = uVar12 >> ((byte)uVar10 & 0x3f);
    pHVar16 = pHVar16 + (uVar15 & 0xff);
    uVar11 = (uint)pHVar16->bits;
    if (8 < uVar11) {
      uVar10 = uVar10 + 8;
      pHVar16 = pHVar16 + (((uint)(uVar15 >> 8) & 0xffffff & kBitMask[pHVar16->bits - 8]) +
                          (uint)pHVar16->value);
      uVar11 = (uint)pHVar16->bits;
    }
    uVar11 = uVar11 + uVar10;
    bVar8 = kBlockLengthPrefixCode[pHVar16->value].nbits;
    uVar3 = kBlockLengthPrefixCode[pHVar16->value].offset;
    if (0x1f < uVar11) {
      uVar11 = uVar11 ^ 0x20;
      (s->br).bit_pos_ = uVar11;
      puVar6 = (uint *)(s->br).next_in;
      uVar12 = uVar12 >> 0x20 | (ulong)*puVar6 << 0x20;
      (s->br).val_ = uVar12;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 4;
      (s->br).next_in = (uint8_t *)(puVar6 + 1);
    }
    uVar10 = kBitMask[(uint)bVar8];
    (s->br).bit_pos_ = uVar11 + bVar8;
    s->block_length[0] = ((uint)(uVar12 >> ((byte)uVar11 & 0x3f)) & uVar10) + (uint)uVar3;
    if (uVar2 == 0) {
      uVar13 = s->block_type_rb[0];
    }
    else if (uVar2 == 1) {
      uVar13 = s->block_type_rb[1] + 1;
    }
    else {
      uVar13 = uVar2 - 2;
    }
    uVar10 = 0;
    if (uVar4 <= uVar13) {
      uVar10 = uVar4;
    }
    uVar13 = uVar13 - uVar10;
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = uVar13;
    if ((s->field_0x338 & 0x40) != 0) {
      if (s->saved_position_literals_begin == 0) {
        sVar9 = (s->literals_block_splits).num_blocks;
      }
      else {
        sVar9 = (s->literals_block_splits).num_blocks;
        (s->literals_block_splits).positions_end[sVar9] = position;
        sVar9 = sVar9 + 1;
        (s->literals_block_splits).num_blocks = sVar9;
      }
      (s->literals_block_splits).positions_begin[sVar9] = position;
      (s->literals_block_splits).types[sVar9] =
           (char)(int)(s->literals_block_splits).num_types_prev_metablocks +
           (char)s->block_type_rb[1];
      uVar12 = (s->literals_block_splits).num_types;
      uVar15 = (ulong)(s->literals_block_splits).types[(s->literals_block_splits).num_blocks] + 1;
      if (uVar15 < uVar12) {
        uVar15 = uVar12;
      }
      (s->literals_block_splits).num_types = uVar15;
      uVar13 = s->block_type_rb[1];
    }
    ppHVar7 = (s->literal_hgroup).htrees;
    s->context_map_slice = s->context_map + (uVar13 << 6);
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0);
    s->literal_htree = ppHVar7[s->context_map[uVar13 << 6]];
    s->context_lookup = "" + ((s->context_modes[uVar13] & 3) << 9);
  }
  return;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}